

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* helics::CoreFactory::getAvailableCoreTypes_abi_cxx11_(void)

{
  size_t sVar1;
  value_type *in_RDI;
  size_t ii;
  size_t builderCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *availableCores;
  value_type *this;
  undefined8 local_30;
  
  this = in_RDI;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x428ae0);
  sVar1 = MasterCoreBuilder::size();
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    MasterCoreBuilder::getIndexedBuilderName_abi_cxx11_((size_t)this);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,in_RDI);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> getAvailableCoreTypes()
{
    std::vector<std::string> availableCores;
    auto builderCount = MasterCoreBuilder::size();
    for (size_t ii = 0; ii < builderCount; ++ii) {
        availableCores.push_back(MasterCoreBuilder::getIndexedBuilderName(ii));
    }
    return availableCores;
}